

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_lazy_message_field_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableLazyMessageOneofFieldLiteGenerator::GenerateParsingCode
          (ImmutableLazyMessageOneofFieldLiteGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&(this->super_ImmutableLazyMessageFieldLiteGenerator).
                              super_ImmutableMessageFieldLiteGenerator.variables_,
                     "if (!($has_oneof_case_message$)) {\n  $oneof_name$_ = new $lazy_type$();\n}\n(($lazy_type$) $oneof_name$_).mergeFrom(input, extensionRegistry);\n$set_oneof_case_message$;\n"
                    );
  return;
}

Assistant:

void ImmutableLazyMessageOneofFieldLiteGenerator::
GenerateParsingCode(io::Printer* printer) const {
  printer->Print(variables_,
    "if (!($has_oneof_case_message$)) {\n"
    "  $oneof_name$_ = new $lazy_type$();\n"
    "}\n"
    "(($lazy_type$) $oneof_name$_).mergeFrom(input, extensionRegistry);\n"
    "$set_oneof_case_message$;\n");
}